

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

unsigned_long QUtil::get_next_utf8_codepoint(string *utf8_val,size_t *pos,bool *error)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  pointer pcVar4;
  byte bVar5;
  ulong uVar6;
  unsigned_long uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  
  uVar8 = *pos;
  uVar6 = utf8_val->_M_string_length;
  uVar1 = uVar8 + 1;
  *pos = uVar1;
  uVar11 = utf8_val->_M_string_length;
  if (uVar11 <= uVar8) {
LAB_002437b8:
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar8,uVar11);
  }
  pcVar4 = (utf8_val->_M_dataplus)._M_p;
  bVar3 = pcVar4[uVar8];
  uVar7 = (unsigned_long)bVar3;
  *error = false;
  if ((char)bVar3 < '\0') {
    if ((bVar3 & 0x40) != 0) {
      uVar9 = 0x40;
      bVar5 = 0x80;
      uVar12 = 0;
      do {
        uVar8 = uVar12;
        uVar12 = uVar8 + 1;
        bVar5 = bVar5 | (byte)uVar9;
        uVar9 = uVar9 >> 1;
      } while ((uVar9 & bVar3) != 0);
      if ((uVar8 < 5) && (uVar12 + uVar1 <= uVar6)) {
        uVar6 = (ulong)(~(uint)bVar5 & (uint)bVar3);
        lVar10 = 1;
        puVar13 = (ulong *)0x2806b8;
        uVar8 = uVar1;
        while( true ) {
          *pos = uVar8 + 1;
          uVar11 = utf8_val->_M_string_length;
          if (uVar11 <= uVar8) break;
          bVar3 = pcVar4[uVar8];
          if ((bVar3 & 0xc0) != 0x80) {
            *pos = uVar8;
            goto LAB_00243795;
          }
          uVar6 = (ulong)(bVar3 & 0x3f) | uVar6 << 6;
          puVar13 = puVar13 + 1;
          lVar2 = uVar12 + lVar10;
          lVar10 = lVar10 + -1;
          uVar8 = uVar8 + 1;
          if (lVar2 == 2) {
            if (3 < (ulong)-lVar10 && lVar10 != -4) {
              return uVar6;
            }
            if (*puVar13 <= uVar6) {
              return uVar6;
            }
            *error = true;
            return uVar6;
          }
        }
        goto LAB_002437b8;
      }
    }
LAB_00243795:
    *error = true;
    uVar7 = 0xfffd;
  }
  return uVar7;
}

Assistant:

unsigned long
QUtil::get_next_utf8_codepoint(std::string const& utf8_val, size_t& pos, bool& error)
{
    auto o_pos = pos;
    size_t len = utf8_val.length();
    unsigned char ch = static_cast<unsigned char>(utf8_val.at(pos++));
    error = false;
    if (ch < 128) {
        return static_cast<unsigned long>(ch);
    }

    size_t bytes_needed = 0;
    unsigned bit_check = 0x40;
    unsigned char to_clear = 0x80;
    while (ch & bit_check) {
        ++bytes_needed;
        to_clear = static_cast<unsigned char>(to_clear | bit_check);
        bit_check >>= 1;
    }
    if (((bytes_needed > 5) || (bytes_needed < 1)) || ((pos + bytes_needed) > len)) {
        error = true;
        return 0xfffd;
    }

    auto codepoint = static_cast<unsigned long>(ch & ~to_clear);
    while (bytes_needed > 0) {
        --bytes_needed;
        ch = static_cast<unsigned char>(utf8_val.at(pos++));
        if ((ch & 0xc0) != 0x80) {
            --pos;
            error = true;
            return 0xfffd;
        }
        codepoint <<= 6;
        codepoint += (ch & 0x3f);
    }
    unsigned long lower_bound = 0;
    switch (pos - o_pos) {
    case 2:
        lower_bound = 1 << 7;
        break;
    case 3:
        lower_bound = 1 << 11;
        break;
    case 4:
        lower_bound = 1 << 16;
        break;
    case 5:
        lower_bound = 1 << 12;
        break;
    case 6:
        lower_bound = 1 << 26;
        break;
    default:
        lower_bound = 0;
    }

    if (lower_bound > 0 && codepoint < lower_bound) {
        // Too many bytes were used, but return whatever character was encoded.
        error = true;
    }
    return codepoint;
}